

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

int nn_sock_send(nn_sock *self,nn_msg *msg,int flags)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint64_t uVar4;
  uint extraout_EDX;
  nn_msg *pnVar5;
  nn_ctx *pnVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  if ((self->socktype->flags & 2) == 0) {
    pnVar6 = &self->ctx;
    nn_ctx_enter(pnVar6);
    if (self->sndtimeo < 0) {
      uVar7 = 0xffffffff;
      uVar9 = 0xffffffffffffffff;
    }
    else {
      uVar4 = nn_clock_ms();
      uVar7 = (ulong)self->sndtimeo;
      uVar9 = uVar4 + uVar7;
    }
    while (uVar1 = self->state - 3, 3 < uVar1) {
      pnVar5 = msg;
      iVar2 = (*self->sockbase->vfptr->send)(self->sockbase,msg);
      iVar3 = 0;
      if (iVar2 == 0) goto LAB_00120758;
      if (-1 < iVar2) {
        nn_sock_send_cold_2();
        uVar1 = extraout_EAX;
LAB_00120784:
        uVar7 = (ulong)uVar1;
        if (uVar1 == 0xffffff92) {
          return -0x6e;
        }
        if (uVar1 == 0xfffffffc) {
          return -4;
        }
        if (uVar1 == 0xfffffff7) {
          return -9;
        }
        nn_sock_send_cold_1();
        if ((*(byte *)(*(long *)(uVar7 + 0x68) + 8) & 1) != 0) {
          return -0x5f;
        }
        pnVar6 = (nn_ctx *)(uVar7 + 0x78);
        nn_ctx_enter(pnVar6);
        if (*(int *)(uVar7 + 0x154) < 0) {
          lVar8 = 0xffffffff;
          uVar9 = 0xffffffffffffffff;
        }
        else {
          uVar4 = nn_clock_ms();
          lVar8 = (long)*(int *)(uVar7 + 0x154);
          uVar9 = uVar4 + lVar8;
        }
        goto LAB_00120807;
      }
      nn_ctx_leave(pnVar6);
      if (iVar2 != -0xb || (flags & 1U) != 0) {
        return iVar2;
      }
      pnVar5 = (nn_msg *)(uVar7 & 0xffffffff);
      uVar1 = nn_efd_wait(&self->sndfd,(int)uVar7);
      if (uVar1 != 0) goto LAB_00120784;
      nn_ctx_enter(pnVar6);
      iVar3 = nn_efd_wait(&self->sndfd,0);
      if (iVar3 == 0) {
        *(byte *)&self->flags = (byte)self->flags | 2;
      }
      if (-1 < self->sndtimeo) {
        uVar4 = nn_clock_ms();
        uVar7 = 0;
        if (uVar4 <= uVar9) {
          uVar7 = uVar9 - uVar4;
        }
      }
    }
    iVar3 = *(int *)(&DAT_00132470 + (ulong)uVar1 * 4);
LAB_00120758:
    nn_ctx_leave(pnVar6);
  }
  else {
    iVar3 = -0x5f;
  }
  return iVar3;
LAB_00120807:
  uVar1 = *(int *)(uVar7 + 0x58) - 3;
  if (uVar1 < 4) {
    iVar3 = *(int *)(&DAT_00132470 + (ulong)uVar1 * 4);
LAB_001208d1:
    nn_ctx_leave(pnVar6);
    return iVar3;
  }
  iVar2 = (**(code **)(**(long **)(uVar7 + 0x60) + 0x40))(*(long **)(uVar7 + 0x60),pnVar5);
  iVar3 = 0;
  if (iVar2 == 0) goto LAB_001208d1;
  if (-1 < iVar2) {
    nn_sock_recv_cold_2();
    uVar1 = extraout_EAX_00;
LAB_001208fd:
    uVar7 = (ulong)uVar1;
    if (uVar1 == 0xffffff92) {
      return -0x6e;
    }
    if (uVar1 == 0xfffffffc) {
      return -4;
    }
    if (uVar1 == 0xfffffff7) {
      return -9;
    }
    nn_sock_recv_cold_1();
    iVar3 = (**(code **)(**(long **)(uVar7 + 0x60) + 0x10))();
    if (-1 < iVar3) {
      *(int *)(uVar7 + 0x1e8) = *(int *)(uVar7 + 0x1e8) + 1;
    }
    return iVar3;
  }
  nn_ctx_leave(pnVar6);
  if (iVar2 != -0xb || (extraout_EDX & 1) != 0) {
    return iVar2;
  }
  uVar1 = nn_efd_wait((nn_efd *)(uVar7 + 0xd4),(int)lVar8);
  if (uVar1 != 0) goto LAB_001208fd;
  nn_ctx_enter(pnVar6);
  iVar3 = nn_efd_wait((nn_efd *)(uVar7 + 0xd4),0);
  if (iVar3 == 0) {
    *(byte *)(uVar7 + 0x70) = *(byte *)(uVar7 + 0x70) | 1;
  }
  if (-1 < *(int *)(uVar7 + 0x154)) {
    uVar4 = nn_clock_ms();
    lVar8 = 0;
    if (uVar4 <= uVar9) {
      lVar8 = uVar9 - uVar4;
    }
  }
  goto LAB_00120807;
}

Assistant:

int nn_sock_send (struct nn_sock *self, struct nn_msg *msg, int flags)
{
    int rc;
    uint64_t deadline;
    uint64_t now;
    int timeout;

    /*  Some sockets types cannot be used for sending messages. */
    if (nn_slow (self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND))
        return -ENOTSUP;

    nn_ctx_enter (&self->ctx);

    /*  Compute the deadline for SNDTIMEO timer. */
    if (self->sndtimeo < 0) {
        deadline = -1;
        timeout = -1;
    }
    else {
        deadline = nn_clock_ms() + self->sndtimeo;
        timeout = self->sndtimeo;
    }

    while (1) {

        switch (self->state) {
        case NN_SOCK_STATE_ACTIVE:
        case NN_SOCK_STATE_INIT:
             break;

        case NN_SOCK_STATE_ZOMBIE:
            /*  If nn_term() was already called, return ETERM. */
            nn_ctx_leave (&self->ctx);
            return -ETERM;

        case NN_SOCK_STATE_STOPPING_EPS:
        case NN_SOCK_STATE_STOPPING:
        case NN_SOCK_STATE_FINI:
            /*  Socket closed or closing.  Should we return something
                else here; recvmsg(2) for example returns no data in
                this case, like read(2).  The use of indexed file
                descriptors is further problematic, as an FD can be reused
                leading to situations where technically the outstanding
                operation should refer to some other socket entirely.  */
            nn_ctx_leave (&self->ctx);
            return -EBADF;
        }

        /*  Try to send the message in a non-blocking way. */
        rc = self->sockbase->vfptr->send (self->sockbase, msg);
        if (nn_fast (rc == 0)) {
            nn_ctx_leave (&self->ctx);
            return 0;
        }
        nn_assert (rc < 0);

        /*  Any unexpected error is forwarded to the caller. */
        if (nn_slow (rc != -EAGAIN)) {
            nn_ctx_leave (&self->ctx);
            return rc;
        }

        /*  If the message cannot be sent at the moment and the send call
            is non-blocking, return immediately. */
        if (nn_fast (flags & NN_DONTWAIT)) {
            nn_ctx_leave (&self->ctx);
            return -EAGAIN;
        }

        /*  With blocking send, wait while there are new pipes available
            for sending. */
        nn_ctx_leave (&self->ctx);
        rc = nn_efd_wait (&self->sndfd, timeout);
        if (nn_slow (rc == -ETIMEDOUT))
            return -ETIMEDOUT;
        if (nn_slow (rc == -EINTR))
            return -EINTR;
        if (nn_slow (rc == -EBADF))
            return -EBADF;
        errnum_assert (rc == 0, rc);
        nn_ctx_enter (&self->ctx);
        /*
         *  Double check if pipes are still available for sending
         */
        if (!nn_efd_wait (&self->sndfd, 0)) {
            self->flags |= NN_SOCK_FLAG_OUT;
        }

        /*  If needed, re-compute the timeout to reflect the time that have
            already elapsed. */
        if (self->sndtimeo >= 0) {
            now = nn_clock_ms();
            timeout = (int) (now > deadline ? 0 : deadline - now);
        }
    }
}